

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_unit.cpp
# Opt level: O3

void anon_unknown.dwarf_7e6f::test_art_is_empty(void **param_1)

{
  _Bool _Var1;
  allocator_type *__a;
  initializer_list<const_char_*> __l;
  initializer_list<(anonymous_namespace)::Value> __l_00;
  art_t art;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> values;
  vector<const_char_*,_std::allocator<const_char_*>_> keys;
  Value val;
  art_t local_90;
  vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_> local_88;
  vector<const_char_*,_std::allocator<const_char_*>_> local_70;
  char *local_58;
  char *pcStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  undefined8 local_30;
  undefined8 local_20;
  undefined8 local_10;
  
  local_38 = "001005";
  local_48 = "000003";
  pcStack_40 = "000004";
  local_58 = "000001";
  pcStack_50 = "000002";
  __a = (allocator_type *)&local_88;
  __l._M_len = 5;
  __l._M_array = &local_58;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&local_70,__l,__a);
  pcStack_50 = (char *)0x1;
  pcStack_40 = (char *)0x2;
  local_30 = 3;
  local_20 = 4;
  local_10 = 5;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_58;
  std::vector<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>::vector
            (&local_88,__l_00,(allocator_type *)__a);
  local_90.root = (art_node_t *)0x0;
  assert_art_valid(&local_90);
  _Var1 = art_is_empty((art_t *)&local_90);
  _assert_true((ulong)_Var1,"art_is_empty(&art)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0xcd);
  pcStack_50 = (char *)0x1;
  art_insert((art_t *)&local_90,(art_key_chunk_t *)"000001",(art_val_t *)&local_58);
  assert_art_valid(&local_90);
  _Var1 = art_is_empty((art_t *)&local_90);
  _assert_true((ulong)!_Var1,"art_is_empty(&art)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/lucaderi[P]CRoaring/tests/art_unit.cpp"
               ,0xd2);
  art_free((art_t *)&local_90);
  if (local_88.
      super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.
                    super__Vector_base<(anonymous_namespace)::Value,_std::allocator<(anonymous_namespace)::Value>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_70.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

DEFINE_TEST(test_art_is_empty) {
    std::vector<const char*> keys = {
        "000001", "000002", "000003", "000004", "001005",
    };
    std::vector<Value> values = {{1}, {2}, {3}, {4}, {5}};

    art_t art{NULL};
    assert_art_valid(&art);
    assert_true(art_is_empty(&art));
    const char* key = "000001";
    Value val{1};
    art_insert(&art, (art_key_chunk_t*)key, &val);
    assert_art_valid(&art);
    assert_false(art_is_empty(&art));
    art_free(&art);
}